

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void armci_read_strided(void *ptr,int stride_levels,int *stride_arr,int *count,char *buf)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  long in_R8;
  char *dptr;
  stride_info_t sitr;
  int off;
  int seg_size;
  stride_info_t *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  void *in_stack_ffffffffffffff68;
  stride_info_t *in_stack_ffffffffffffff70;
  int local_30;
  
  iVar1 = *in_RCX;
  local_30 = 0;
  if (0 < *in_RCX) {
    armci_stride_info_init
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50);
    while( true ) {
      iVar2 = armci_stride_info_has_more((stride_info_t *)0x262dcb);
      if (iVar2 == 0) break;
      in_stack_ffffffffffffff50 =
           (stride_info_t *)armci_stride_info_seg_ptr(in_stack_ffffffffffffff50);
      memcpy(in_stack_ffffffffffffff50,(void *)(in_R8 + local_30),(long)iVar1);
      local_30 = iVar1 + local_30;
      armci_stride_info_next(in_stack_ffffffffffffff50);
    }
    armci_stride_info_destroy((stride_info_t *)&stack0xffffffffffffff58);
    return;
  }
  __assert_fail("count[0]>0",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0xb8,"void armci_read_strided(void *, int, int *, int *, char *)");
}

Assistant:

void armci_read_strided(
        void *ptr, int stride_levels, int stride_arr[], int count[], char *buf)
{
  const int seg_size = count[0];
  int off;
  stride_info_t sitr;
  off=0;
  assert(count[0]>0);
  armci_stride_info_init(&sitr,ptr,stride_levels,stride_arr,count);
  while(armci_stride_info_has_more(&sitr)) {
    char *dptr = armci_stride_info_seg_ptr(&sitr);
    memcpy(dptr,&buf[off],seg_size);
    off += seg_size;
    armci_stride_info_next(&sitr);
  }
  armci_stride_info_destroy(&sitr);
}